

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_util.hpp
# Opt level: O0

string * duckdb::StringUtil::Format<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
                   (string *fmt_str,
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params,
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params_1,
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params_2)

{
  string *in_RCX;
  string *in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  string *in_RDI;
  string *in_R8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unaff_retaddr;
  string *in_stack_00000008;
  string local_98 [48];
  string local_68 [32];
  string local_48 [56];
  string *params_1_00;
  
  params_1_00 = in_RDI;
  ::std::__cxx11::string::string(local_48,in_RDX);
  ::std::__cxx11::string::string(local_68,in_RCX);
  ::std::__cxx11::string::string(local_98,in_R8);
  Exception::ConstructMessage<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
            (in_stack_00000008,unaff_retaddr,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)params_1_00,in_RSI
            );
  ::std::__cxx11::string::~string(local_98);
  ::std::__cxx11::string::~string(local_68);
  ::std::__cxx11::string::~string(local_48);
  return in_RDI;
}

Assistant:

static string Format(const string fmt_str, ARGS... params) {
		return Exception::ConstructMessage(fmt_str, params...);
	}